

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

err_t rngSysRead(void *buf,size_t *read,size_t count)

{
  FILE *__stream;
  size_t sVar1;
  char *in_RDX;
  file_t in_RSI;
  size_t in_RDI;
  file_t file;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar2;
  
  __stream = (FILE *)fileOpen(in_RDX,in_stack_ffffffffffffffd8);
  if (__stream == (FILE *)0x0) {
    eVar2 = 0xcb;
  }
  else {
    sVar1 = fileRead2((void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                      in_RSI);
    *(size_t *)in_RSI = sVar1;
    fclose(__stream);
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

static err_t rngSysRead(void* buf, size_t* read, size_t count)
{
	file_t file;
	ASSERT(memIsValid(read, sizeof(size_t)));
	ASSERT(memIsValid(buf, count));
	file = fileOpen("/dev/urandom", "rb");
	if (!file)
		return ERR_FILE_OPEN;
	*read = fileRead2(buf, count, file);
	fclose(file);
	return ERR_OK;
}